

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_derive.c
# Opt level: O0

int derive(EVP_PKEY *keyA,EVP_PKEY *keyB,int dgst_nid,int ukm_len,size_t *len)

{
  int iVar1;
  uchar *key;
  uchar *skey;
  uchar ukm [32];
  EVP_PKEY_CTX *ctx;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  EVP_PKEY_CTX *local_28;
  size_t *local_20;
  uint local_18;
  int local_14;
  EVP_PKEY *local_10;
  EVP_PKEY *local_8;
  
  local_20 = len;
  local_18 = ukm_len;
  local_14 = dgst_nid;
  local_10 = (EVP_PKEY *)keyB;
  local_8 = keyA;
  local_28 = EVP_PKEY_CTX_new((EVP_PKEY *)keyA,(ENGINE *)0x0);
  if (local_28 == (EVP_PKEY_CTX *)0x0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_PKEY_CTX_new(keyA, NULL)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x11f);
  }
  iVar1 = EVP_PKEY_derive_init(local_28);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_derive_init(ctx)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x120);
  }
  iVar1 = EVP_PKEY_derive_set_peer(local_28,local_10);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_derive_set_peer(ctx, keyB)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x121);
  }
  if ((local_14 != 0) &&
     (iVar1 = EVP_PKEY_CTX_ctrl(local_28,-1,-1,0x100b,local_14,(void *)0x0), iVar1 == 0)) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_CTX_ctrl(ctx, -1, -1, EVP_PKEY_CTRL_SET_VKO, dgst_nid, NULL)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x124);
  }
  if (local_18 != 0) {
    local_48 = 1;
    local_40 = 0;
    local_38 = 0;
    local_30 = 0;
    if (0x20 < local_18) {
      OPENSSL_die("assertion failed: ukm_len <= sizeof(ukm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                  ,0x128);
    }
    iVar1 = EVP_PKEY_CTX_ctrl(local_28,-1,-1,8,local_18,&local_48);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_PKEY_CTX_ctrl(ctx, -1, -1, EVP_PKEY_CTRL_SET_IV, ukm_len, ukm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                  ,0x12a);
    }
  }
  iVar1 = EVP_PKEY_derive(local_28,(uchar *)0x0,local_20);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_derive(ctx, NULL, len)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x12d);
  }
  key = (uchar *)CRYPTO_malloc((int)*local_20,
                               "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                               ,0x12f);
  if (key == (uchar *)0x0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("skey = OPENSSL_malloc(*len)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x12f);
  }
  iVar1 = EVP_PKEY_derive(local_28,key,local_20);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_derive(ctx, skey, len)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x131);
  }
  EVP_PKEY_CTX_free(local_28);
  return (int)key;
}

Assistant:

unsigned char *derive(EVP_PKEY *keyA, EVP_PKEY *keyB, int dgst_nid,
                      int ukm_len, size_t *len)
{
    EVP_PKEY_CTX *ctx;
    T(ctx = EVP_PKEY_CTX_new(keyA, NULL));
    T(EVP_PKEY_derive_init(ctx));
    T(EVP_PKEY_derive_set_peer(ctx, keyB));
    if (dgst_nid)
        T(EVP_PKEY_CTX_ctrl(ctx, -1, -1, EVP_PKEY_CTRL_SET_VKO,
                            dgst_nid, NULL));
    if (ukm_len) {
        unsigned char ukm[32] = { 1 };

        OPENSSL_assert(ukm_len <= sizeof(ukm));
        T(EVP_PKEY_CTX_ctrl(ctx, -1, -1, EVP_PKEY_CTRL_SET_IV,
                            ukm_len, ukm));
    }

    T(EVP_PKEY_derive(ctx, NULL, len));
    unsigned char *skey;
    T(skey = OPENSSL_malloc(*len));

    T(EVP_PKEY_derive(ctx, skey, len));
#ifdef DEBUG
    BIO_dump_fp(stdout, skey, *len);
#endif
    EVP_PKEY_CTX_free(ctx);
    return skey;
}